

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O3

Literal * __thiscall
wasm::ShellExternalInterface::tableLoad
          (Literal *__return_storage_ptr__,ShellExternalInterface *this,Name tableName,Address index
          )

{
  _Hash_node_base *p_Var1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  Literal *extraout_RAX;
  ulong uVar4;
  undefined1 local_38 [8];
  Name tableName_local;
  
  tableName_local.super_IString.str._M_len = tableName.super_IString.str._M_str;
  local_38 = tableName.super_IString.str._M_len;
  p_Var2 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->tables)._M_h,
                      tableName_local.super_IString.str._M_len % (this->tables)._M_h._M_bucket_count
                      ,(key_type *)local_38,tableName_local.super_IString.str._M_len);
  if ((p_Var2 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var2->_M_nxt, p_Var1 != (_Hash_node_base *)0x0)) {
    p_Var3 = p_Var1[3]._M_nxt;
    uVar4 = ((long)p_Var1[4]._M_nxt - (long)p_Var3 >> 3) * -0x5555555555555555;
    if (uVar4 < index.addr || uVar4 - index.addr == 0) {
      (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
                (this,"out of bounds table access");
      p_Var3 = p_Var1[3]._M_nxt;
    }
    wasm::Literal::Literal(__return_storage_ptr__,(Literal *)(p_Var3 + index.addr * 3));
    return __return_storage_ptr__;
  }
  tableLoad(this);
  ~ShellExternalInterface(this);
  operator_delete(this,0xa0);
  return extraout_RAX;
}

Assistant:

Literal tableLoad(Name tableName, Address index) override {
    auto it = tables.find(tableName);
    if (it == tables.end()) {
      trap("tableGet on non-existing table");
    }

    auto& table = it->second;
    if (index >= table.size()) {
      trap("out of bounds table access");
    }

    return table[index];
  }